

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<32,_2048>::FinalizePending(ObjectBlockPool<32,_2048> *this)

{
  uint uVar1;
  SmallBlock<32> *marker;
  ulong uVar2;
  SmallBlock<32> **ppSVar3;
  ExternTypeInfo *elementType;
  uint uVar4;
  uint index;
  
  uVar1 = (this->objectsToFinalize).count;
  for (index = 0; uVar1 != index; index = index + 1) {
    ppSVar3 = FastVector<SmallBlock<32>_*,_false,_false>::operator[](&this->objectsToFinalize,index)
    ;
    marker = *ppSVar3;
    uVar2 = marker->marker;
    marker->marker = uVar2 | 1;
    elementType = FastVector<ExternTypeInfo,_false,_false>::operator[]
                            ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::linker + 0x200),
                             (uint)(uVar2 >> 8) & 0xffffff);
    if ((marker->data[0] & 0x10U) == 0) {
      GC::CheckVariable(marker->data + 8,elementType);
    }
    else {
      uVar4._0_1_ = elementType->defaultAlign;
      uVar4._1_1_ = elementType->typeFlags;
      uVar4._2_2_ = elementType->pointerCount;
      if ((byte)(undefined1)uVar4 < 5) {
        uVar4 = 4;
      }
      GC::CheckArrayElements
                (marker->data + (ulong)(uVar4 & 0xff) + 8,
                 *(uint *)((long)marker + (ulong)(uVar4 & 0xff) + 4),elementType);
    }
    NULLC::FinalizeObject(&marker->marker,(char *)marker);
  }
  (this->objectsToFinalize).count = 0;
  return;
}

Assistant:

void FinalizePending()
	{
		for(unsigned i = 0, e = objectsToFinalize.size(); i < e; i++)
		{
			MySmallBlock *block = objectsToFinalize[i];

			markerType &marker = block->marker;

			// Mark block as used
			marker |= NULLC::OBJECT_VISIBLE;

			ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

			char *base = block->data;

			if(marker & NULLC::OBJECT_ARRAY)
			{
				unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

				unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);

				GC::CheckArrayElements(base + sizeof(markerType) + arrayPadding, count, typeInfo);
			}
			else
			{
				GC::CheckVariable(base + sizeof(markerType), typeInfo);
			}

			NULLC::FinalizeObject(marker, block->data);
		}

		objectsToFinalize.clear();
	}